

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdSetPsbtSighashType(void *handle,void *psbt_handle,char *txid,uint32_t vout,int sighash_type)

{
  bool bVar1;
  undefined8 uVar2;
  CfdException *this;
  uint32_t in_ECX;
  Psbt *in_RDX;
  long in_RSI;
  SigHashAlgorithm in_R8D;
  CfdException *except;
  exception *std_except;
  OutPoint outpoint;
  CfdCapiPsbtHandle *psbt_obj;
  int result;
  SigHashType *in_stack_fffffffffffffe30;
  OutPoint *outpoint_00;
  string *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  CfdError error_code;
  allocator *paVar3;
  CfdException *in_stack_fffffffffffffe50;
  SigHashType local_168;
  allocator local_159;
  string local_158;
  Txid local_138;
  OutPoint local_118;
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [32];
  string *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  allocator local_a9;
  string local_a8 [32];
  CfdSourceLocation local_88;
  long local_70;
  allocator local_61;
  string local_60 [52];
  undefined4 local_2c;
  SigHashAlgorithm local_28;
  uint32_t local_24;
  Psbt *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  local_2c = 0xffffffff;
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"PsbtHandle",&local_61);
  cfd::capi::CheckBuffer
            ((void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_70 = local_18;
  bVar1 = cfd::capi::IsEmptyString((char *)local_20);
  if (bVar1) {
    local_88.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_88.filename = local_88.filename + 1;
    local_88.line = 0x3ba;
    local_88.funcname = "CfdSetPsbtSighashType";
    cfd::core::logger::warn<>(&local_88,"txid is null or empty.");
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"Failed to parameter. txid is null or empty.",&local_a9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe50,error_code,in_stack_fffffffffffffe40);
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(local_70 + 0x18) == 0) {
    strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_psbt.cpp"
            ,0x2f);
    cfd::core::logger::warn<>((CfdSourceLocation *)&stack0xffffffffffffff38,"psbt is null.");
    local_ea = 1;
    this = (CfdException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"Failed to handle statement. psbt is null.",&local_e9);
    cfd::core::CfdException::CfdException(this,error_code,in_stack_fffffffffffffe40);
    local_ea = 0;
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  paVar3 = &local_159;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,(char *)local_20,paVar3);
  cfd::core::Txid::Txid(&local_138,&local_158);
  cfd::core::OutPoint::OutPoint(&local_118,&local_138,local_24);
  cfd::core::Txid::~Txid((Txid *)0x5ef93e);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  outpoint_00 = *(OutPoint **)(local_70 + 0x18);
  cfd::core::SigHashType::SigHashType(&local_168,local_28,false,false);
  cfd::Psbt::SetTxInSighashType(local_20,outpoint_00,in_stack_fffffffffffffe30);
  local_4 = 0;
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x5ef9ae);
  return local_4;
}

Assistant:

int CfdSetPsbtSighashType(
    void* handle, void* psbt_handle, const char* txid, uint32_t vout,
    int sighash_type) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }
    OutPoint outpoint(Txid(txid), vout);

    psbt_obj->psbt->SetTxInSighashType(
        outpoint, SigHashType(static_cast<SigHashAlgorithm>(sighash_type)));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}